

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtx_trylock.c
# Opt level: O3

int mtx_trylock(mtx_t *mtx)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)mtx);
  uVar2 = 1;
  if (iVar1 != 0) {
    uVar2 = iVar1 == 0x10 ^ 3;
  }
  return uVar2;
}

Assistant:

int mtx_trylock( mtx_t * mtx )
{
    switch ( pthread_mutex_trylock( mtx ) )
    {
        case 0:
            return thrd_success;

        case EBUSY:
            return thrd_busy;

        default:
            return thrd_error;
    }
}